

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_arena.h
# Opt level: O1

void * __thiscall
google::protobuf::internal::SerialArena::
AllocateAligned<(google::protobuf::internal::AllocationClient)1>(SerialArena *this,size_t n)

{
  Nonnull<const_char_*> pcVar1;
  char *v1;
  atomic<char_*> local_28;
  
  v1 = (char *)&stack0xffffffffffffffd8;
  if ((n & 7) == 0) {
    n = (size_t)(this->ptr_)._M_b._M_p;
    v1 = this->limit_;
    if (n <= v1) {
      pcVar1 = (Nonnull<const_char_*>)0x0;
      goto LAB_00efa92f;
    }
  }
  else {
    AllocateAligned<(google::protobuf::internal::AllocationClient)1>
              ((SerialArena *)&stack0xffffffffffffffd8);
  }
  pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<char_const*,char_const*>
                     (v1,(char *)n,"limit_ >= ptr()");
LAB_00efa92f:
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    AllocateAligned<(google::protobuf::internal::AllocationClient)1>();
    return local_28._M_b._M_p._M_p;
  }
  AllocateAligned<(google::protobuf::internal::AllocationClient)1>();
}

Assistant:

void* AllocateAligned(size_t n) {
    ABSL_DCHECK(internal::ArenaAlignDefault::IsAligned(n));
    ABSL_DCHECK_GE(limit_, ptr());

    if (alloc_client == AllocationClient::kArray) {
      if (void* res = TryAllocateFromCachedBlock(n)) {
        return res;
      }
    }

    void* ptr;
    if (ABSL_PREDICT_TRUE(MaybeAllocateAligned(n, &ptr))) {
      return ptr;
    }
    return AllocateAlignedFallback(n);
  }